

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O3

void __thiscall
iaf_psc_alpha::iaf_psc_alpha
          (iaf_psc_alpha *this,long n_populationID,int n_neuronID,iaf_psc_alpha_param *param)

{
  Logging *pLVar1;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_0010fc98;
  this->shouldCalibrate = true;
  this->param = param;
  this->y0_ = 0.0;
  this->dI_ex_ = 0.0;
  this->I_ex_ = 0.0;
  this->dI_in_ = 0.0;
  this->I_in_ = 0.0;
  this->y3_ = 0.0;
  this->r_ = 0;
  this->ex_spikes_ = 0.0;
  this->in_spikes_ = 0.0;
  (this->super_Neuron).populationID = n_populationID;
  (this->super_Neuron).neuronID = n_neuronID;
  pLVar1 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar1;
  return;
}

Assistant:

iaf_psc_alpha::iaf_psc_alpha(long n_populationID, int n_neuronID, iaf_psc_alpha_param* param) : param(param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    initialize();
}